

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number chaiscript::Boxed_Number::pre_decrement(Boxed_Number *t_lhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Boxed_Number BVar1;
  Boxed_Value *v;
  Boxed_Number *in_stack_ffffffffffffffd0;
  Opers in_stack_ffffffffffffffdc;
  Boxed_Value local_20 [2];
  
  v = local_20;
  oper(in_stack_ffffffffffffffdc,&in_stack_ffffffffffffffd0->bv);
  Boxed_Number(in_stack_ffffffffffffffd0,v);
  Boxed_Value::~Boxed_Value((Boxed_Value *)0x3af7ac);
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Boxed_Number)
         BVar1.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number pre_decrement(Boxed_Number t_lhs)
      {
        return oper(Operators::pre_decrement, t_lhs.bv);
      }